

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void __thiscall
doctest::anon_unknown_14::XmlReporter::test_run_end(XmlReporter *this,TestRunStats *p)

{
  XmlWriter *this_00;
  allocator<char> local_93;
  allocator<char> local_92;
  allocator<char> local_91;
  undefined1 local_90 [12];
  int local_84;
  string local_80;
  string local_60;
  string local_40;
  
  if (this->tc != (TestCaseData *)0x0) {
    XmlWriter::endElement(&this->xml);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"OverallResultsAsserts",&local_92);
  this_00 = &this->xml;
  XmlWriter::scopedElement((XmlWriter *)local_90,(string *)this_00);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"successes",&local_93);
  local_84 = p->numAsserts - p->numAssertsFailed;
  XmlWriter::writeAttribute<int>
            ((XmlWriter *)CONCAT44(local_90._4_4_,local_90._0_4_),&local_40,&local_84);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"failures",&local_91);
  XmlWriter::writeAttribute<int>
            ((XmlWriter *)CONCAT44(local_90._4_4_,local_90._0_4_),&local_60,&p->numAssertsFailed);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_90);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"OverallResultsTestCases",(allocator<char> *)&local_84);
  XmlWriter::startElement(this_00,&local_80);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"successes",&local_92);
  local_90._0_4_ = p->numTestCasesPassingFilters - p->numTestCasesFailed;
  XmlWriter::writeAttribute<unsigned_int>(this_00,&local_40,(uint *)local_90);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"failures",&local_93);
  XmlWriter::writeAttribute<unsigned_int>(this_00,&local_60,&p->numTestCasesFailed);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_80);
  if (this->opt->no_skipped_summary == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"skipped",(allocator<char> *)&local_60);
    local_40._M_dataplus._M_p._0_4_ = p->numTestCases - p->numTestCasesPassingFilters;
    XmlWriter::writeAttribute<unsigned_int>(this_00,&local_80,(uint *)&local_40);
    std::__cxx11::string::~string((string *)&local_80);
  }
  XmlWriter::endElement(this_00);
  XmlWriter::endElement(this_00);
  return;
}

Assistant:

void test_run_end(const TestRunStats& p) override {
            if(tc) // the TestSuite tag - only if there has been at least 1 test case
                xml.endElement();

            xml.scopedElement("OverallResultsAsserts")
                    .writeAttribute("successes", p.numAsserts - p.numAssertsFailed)
                    .writeAttribute("failures", p.numAssertsFailed);

            xml.startElement("OverallResultsTestCases")
                    .writeAttribute("successes",
                                    p.numTestCasesPassingFilters - p.numTestCasesFailed)
                    .writeAttribute("failures", p.numTestCasesFailed);
            if(opt.no_skipped_summary == false)
                xml.writeAttribute("skipped", p.numTestCases - p.numTestCasesPassingFilters);
            xml.endElement();

            xml.endElement();
        }